

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt32 tt_cmap10_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort *puVar6;
  ushort uVar7;
  int iVar8;
  
  if (*pchar_code == 0xffffffff) {
    return 0;
  }
  pFVar1 = cmap->data;
  uVar2 = *(uint *)(pFVar1 + 0x10);
  uVar3 = *(uint *)(pFVar1 + 0xc);
  uVar5 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *pchar_code + 1;
  if (uVar3 <= uVar5) {
    uVar3 = uVar5;
  }
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (uVar3 - uVar5 < uVar2) {
    puVar6 = (ushort *)(pFVar1 + (ulong)((uVar3 - uVar5) * 2) + 0x14);
    do {
      uVar7 = *puVar6 << 8 | *puVar6 >> 8;
      if (uVar7 != 0) {
        uVar2 = (uint)uVar7;
        goto LAB_00245a3d;
      }
      if (uVar3 == 0xffffffff) {
        return 0;
      }
      uVar4 = uVar3 + 1;
      iVar8 = uVar3 - uVar5;
      puVar6 = puVar6 + 1;
      uVar3 = uVar4;
    } while (iVar8 + 1U < uVar2);
  }
  uVar2 = 0;
LAB_00245a3d:
  *pchar_code = uVar3;
  return uVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap10_char_next( TT_CMap     cmap,
                       FT_UInt32  *pchar_code )
  {
    FT_Byte*   table     = cmap->data;
    FT_UInt32  char_code;
    FT_UInt    gindex    = 0;
    FT_Byte*   p         = table + 12;
    FT_UInt32  start     = TT_NEXT_ULONG( p );
    FT_UInt32  count     = TT_NEXT_ULONG( p );
    FT_UInt32  idx;


    if ( *pchar_code >= 0xFFFFFFFFUL )
      return 0;

    char_code = *pchar_code + 1;

    if ( char_code < start )
      char_code = start;

    idx = char_code - start;
    p  += 2 * idx;

    for ( ; idx < count; idx++ )
    {
      gindex = TT_NEXT_USHORT( p );
      if ( gindex != 0 )
        break;

      if ( char_code >= 0xFFFFFFFFUL )
        return 0;

      char_code++;
    }

    *pchar_code = char_code;
    return gindex;
  }